

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleTouchEvent(QWidgetWindow *this,QTouchEvent *event)

{
  bool bVar1;
  Type TVar2;
  int __fd;
  QWidget *pQVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  sockaddr *__addr;
  QEvent *in_RSI;
  ulong in_stack_00000028;
  QPointingDevice *in_stack_00000030;
  QTouchEvent *in_stack_00000050;
  QWidget *in_stack_00000058;
  quint64 qVar3;
  
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == TouchCancel) {
    QPointerEvent::pointingDevice();
    qVar3 = QInputEvent::timestamp((QInputEvent *)in_RSI);
    __fd = (int)qVar3;
    QApplicationPrivate::translateTouchCancel(in_stack_00000030,in_stack_00000028);
    QEvent::accept(in_RSI,__fd,__addr,(socklen_t *)CONCAT71(in_register_00000009,in_CL));
  }
  else {
    pQVar4 = QApplication::activePopupWidget();
    if (pQVar4 == (QWidget *)0x0) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b56ad);
      bVar1 = QApplicationPrivate::translateRawTouchEvent(in_stack_00000058,in_stack_00000050);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    }
    else {
      QEvent::ignore(in_RSI);
    }
  }
  return;
}

Assistant:

void QWidgetWindow::handleTouchEvent(QTouchEvent *event)
{
    if (event->type() == QEvent::TouchCancel) {
        QApplicationPrivate::translateTouchCancel(event->pointingDevice(), event->timestamp());
        event->accept();
    } else if (QApplication::activePopupWidget()) {
        // Ignore touch events for popups. This will cause QGuiApplication to synthesise mouse
        // events instead, which QWidgetWindow::handleMouseEvent will forward correctly:
        event->ignore();
    } else {
        event->setAccepted(QApplicationPrivate::translateRawTouchEvent(m_widget, event));
    }
}